

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O1

bool __thiscall
OpenMD::MoleculeStamp::addConstraintStamp(MoleculeStamp *this,ConstraintStamp *constraint)

{
  pointer *pppCVar1;
  iterator __position;
  ConstraintStamp *local_8;
  
  __position._M_current =
       (this->constraintStamps_).
       super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->constraintStamps_).
      super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = constraint;
    std::vector<OpenMD::ConstraintStamp*,std::allocator<OpenMD::ConstraintStamp*>>::
    _M_realloc_insert<OpenMD::ConstraintStamp*const&>
              ((vector<OpenMD::ConstraintStamp*,std::allocator<OpenMD::ConstraintStamp*>> *)
               &this->constraintStamps_,__position,&local_8);
  }
  else {
    *__position._M_current = constraint;
    pppCVar1 = &(this->constraintStamps_).
                super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return true;
}

Assistant:

bool MoleculeStamp::addConstraintStamp(ConstraintStamp* constraint) {
    constraintStamps_.push_back(constraint);
    return true;
  }